

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O0

void __thiscall
duckdb::WindowAggregateExecutor::EvaluateInternal
          (WindowAggregateExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowAggregateExecutorLocalState *pWVar1;
  type pWVar2;
  pointer pWVar3;
  type pWVar4;
  WindowExecutorState *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  WindowAggregatorState *agg_state;
  unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
  *gsink;
  WindowAggregateExecutorLocalState *lastate;
  WindowAggregateExecutorGlobalState *gastate;
  
  WindowExecutorState::Cast<duckdb::WindowAggregateExecutorGlobalState>(in_RDI);
  pWVar1 = WindowExecutorState::Cast<duckdb::WindowAggregateExecutorLocalState>(in_RDI);
  pWVar2 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)in_RDI);
  pWVar3 = unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>,_true>
           ::operator->((unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>,_true>
                         *)in_RDI);
  pWVar4 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)in_RDI);
  (*pWVar3->_vptr_WindowAggregator[6])
            (pWVar3,pWVar4,pWVar2,&(pWVar1->super_WindowExecutorBoundsState).bounds,in_R8,in_R9,
             in_stack_00000008);
  return;
}

Assistant:

void WindowAggregateExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                               DataChunk &eval_chunk, Vector &result, idx_t count,
                                               idx_t row_idx) const {
	auto &gastate = gstate.Cast<WindowAggregateExecutorGlobalState>();
	auto &lastate = lstate.Cast<WindowAggregateExecutorLocalState>();
	auto &gsink = gastate.gsink;
	D_ASSERT(aggregator);

	auto &agg_state = *lastate.aggregator_state;

	aggregator->Evaluate(*gsink, agg_state, lastate.bounds, result, count, row_idx);
}